

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O2

void __thiscall
trun::TestRunner::AddDependenciesForModule
          (TestRunner *this,string *moduleName,string *dependencyList)

{
  element_type *this_00;
  pointer pbVar1;
  pointer pbVar2;
  Ref tm;
  Ref mod_dep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deplist;
  __shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  deplist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deplist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deplist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  split(&deplist,(dependencyList->_M_dataplus)._M_p,0x2c);
  ModuleFromName((TestRunner *)&tm,(string *)this);
  pbVar1 = deplist.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (tm.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    (*this->pLogger->_vptr_ILogger[4])
              (this->pLogger,"Module not found; \'%s\'",(moduleName->_M_dataplus)._M_p);
  }
  else {
    for (pbVar2 = deplist.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1)
    {
      ModuleFromName((TestRunner *)&mod_dep,(string *)this);
      this_00 = tm.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (mod_dep.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        (*this->pLogger->_vptr_ILogger[4])
                  (this->pLogger,"Module Dependency not found; \'%s\'",(pbVar2->_M_dataplus)._M_p);
      }
      else {
        std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,(__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)&mod_dep)
        ;
        TestModule::AddDependency(this_00,(Ref *)&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mod_dep.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tm.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&deplist);
  return;
}

Assistant:

void TestRunner::AddDependenciesForModule(const std::string &moduleName, const std::string &dependencyList) {
    std::vector<std::string> deplist;
    trun::split(deplist, dependencyList.c_str(), ',');

    auto tm = ModuleFromName(moduleName);
    if (tm == nullptr) {
        pLogger->Error("Module not found; '%s'", moduleName.c_str());
        return;
    }
    for(auto &dep : deplist) {
        auto mod_dep = ModuleFromName(dep);
        if (mod_dep == nullptr) {
            pLogger->Error("Module Dependency not found; '%s'", dep.c_str());
            continue;
        }
        tm->AddDependency(mod_dep);
    }
}